

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void getPU(double *A,int M,int N,int *ipiv,double *P,double *U)

{
  void *__ptr;
  void *__ptr_00;
  double *L;
  int *ipivt;
  int local_38;
  int K;
  int j;
  int i;
  double *U_local;
  double *P_local;
  int *ipiv_local;
  int N_local;
  int M_local;
  double *A_local;
  
  __ptr = malloc((long)M << 2);
  for (K = 0; K < M; K = K + 1) {
    *(int *)((long)__ptr + (long)ipiv[K] * 4) = K;
  }
  ipivt._4_4_ = M;
  if (N < M) {
    ipivt._4_4_ = N;
  }
  __ptr_00 = malloc((long)M * 8 * (long)ipivt._4_4_);
  if (M == N) {
    if (__ptr_00 != (void *)0x0) {
      for (K = 0; K < M; K = K + 1) {
        for (local_38 = 0; local_38 < K; local_38 = local_38 + 1) {
          *(double *)((long)__ptr_00 + (long)(K * M + local_38) * 8) = A[K * M + local_38];
        }
        *(undefined8 *)((long)__ptr_00 + (long)(K * M + K) * 8) = 0x3ff0000000000000;
        local_38 = K;
        while (local_38 = local_38 + 1, local_38 < M) {
          *(undefined8 *)((long)__ptr_00 + (long)(K * M + local_38) * 8) = 0;
        }
      }
    }
    if (U != (double *)0x0) {
      for (K = 0; K < M; K = K + 1) {
        for (local_38 = 0; local_38 < K; local_38 = local_38 + 1) {
          U[K * M + local_38] = 0.0;
        }
        for (local_38 = K; local_38 < M; local_38 = local_38 + 1) {
          U[K * M + local_38] = A[K * M + local_38];
        }
      }
    }
  }
  else if (N < M) {
    if (__ptr_00 != (void *)0x0) {
      for (K = 0; K < N; K = K + 1) {
        for (local_38 = 0; local_38 < K; local_38 = local_38 + 1) {
          *(double *)((long)__ptr_00 + (long)(K * N + local_38) * 8) = A[K * N + local_38];
        }
        *(undefined8 *)((long)__ptr_00 + (long)(K * N + K) * 8) = 0x3ff0000000000000;
        local_38 = K;
        while (local_38 = local_38 + 1, local_38 < N) {
          *(undefined8 *)((long)__ptr_00 + (long)(K * N + local_38) * 8) = 0;
        }
      }
      memcpy((void *)((long)__ptr_00 + (long)(N * N) * 8),A + N * N,(long)(M - N) * 8 * (long)N);
    }
    if (U != (double *)0x0) {
      for (K = 0; K < N; K = K + 1) {
        for (local_38 = 0; local_38 < K; local_38 = local_38 + 1) {
          U[K * N + local_38] = 0.0;
        }
        for (local_38 = K; local_38 < N; local_38 = local_38 + 1) {
          U[K * N + local_38] = A[K * N + local_38];
        }
      }
    }
  }
  else if (M < N) {
    if (__ptr_00 != (void *)0x0) {
      for (K = 0; K < M; K = K + 1) {
        for (local_38 = 0; local_38 < K; local_38 = local_38 + 1) {
          *(double *)((long)__ptr_00 + (long)(K * M + local_38) * 8) = A[K * N + local_38];
        }
        *(undefined8 *)((long)__ptr_00 + (long)(K * M + K) * 8) = 0x3ff0000000000000;
        local_38 = K;
        while (local_38 = local_38 + 1, local_38 < M) {
          *(undefined8 *)((long)__ptr_00 + (long)(K * M + local_38) * 8) = 0;
        }
      }
    }
    if (U != (double *)0x0) {
      for (K = 0; K < M; K = K + 1) {
        for (local_38 = 0; local_38 < K; local_38 = local_38 + 1) {
          U[K * N + local_38] = 0.0;
        }
        for (local_38 = K; local_38 < N; local_38 = local_38 + 1) {
          U[K * N + local_38] = A[K * N + local_38];
        }
      }
    }
  }
  for (K = 0; K < M; K = K + 1) {
    memcpy(P + K * ipivt._4_4_,
           (void *)((long)__ptr_00 + (long)(*(int *)((long)__ptr + (long)K * 4) * ipivt._4_4_) * 8),
           (long)ipivt._4_4_ << 3);
  }
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void getPU(double *A, int M, int N, int *ipiv, double *P,double *U) {
	int i,j,K;
	int *ipivt;
	double *L;

	ipivt = (int*)malloc(sizeof(int)*M);

	for (i = 0; i < M; ++i) {
		ipivt[ipiv[i]] = i;
	}

	if (M > N) {
		K = N;
	}
	else {
		K = M;
	}

	L = (double*)malloc(sizeof(double)*M*K);

	if (M == N) {
		if (L) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*M + j] = A[i*M + j];
				}
				L[i*M + i] = 1.0;
				for (j = i + 1; j < M; ++j) {
					L[i*M + j] = 0.0;
				}
			}
		}
		if (U) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*M + j] = 0.0;
				}
				for (j = i; j < M; ++j) {
					U[i*M + j] = A[i*M + j];
				}
			}
		}
	}
	else if (M > N) {
		if (L) {
			for (i = 0; i < N; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*N + j] = A[i*N + j];
				}
				L[i*N + i] = 1.0;
				for (j = i + 1; j < N; ++j) {
					L[i*N + j] = 0.0;
				}
			}
			memcpy(L + N*N, A + N*N, sizeof(double)*(M - N)*N);
		}
		if (U) {
			for (i = 0; i < N; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*N + j] = 0.0;
				}
				for (j = i; j < N; ++j) {
					U[i*N + j] = A[i*N + j];
				}
			}
		}
	}
	else if (M < N) {
		if (L) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*M + j] = A[i*N + j];
				}
				L[i*M + i] = 1.0;
				for (j = i + 1; j < M; ++j) {
					L[i*M + j] = 0.0;
				}
			}
		}

		if (U) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*N + j] = 0.0;
				}
				for (j = i; j < N; ++j) {
					U[i*N + j] = A[i*N + j];
				}
			}
		}
	}

	for (i = 0; i < M; ++i) {
		memcpy(P + i*K, L + ipivt[i] * K, sizeof(double)*K);
	}


	free(ipivt);
	free(L);
}